

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

int sparse_column_next(ecs_table_t *table,ecs_matched_table_t *matched_table,
                      ecs_vector_t *sparse_columns,ecs_query_iter_t *iter,ecs_page_cursor_t *cur)

{
  ecs_switch_t *sw_00;
  int32_t iVar1;
  void *pvVar2;
  undefined8 *puVar3;
  uint64_t uVar4;
  bool bVar5;
  int local_70;
  int32_t count;
  int32_t i;
  int32_t first;
  ecs_entity_t case_smallest;
  ecs_switch_t *sw_smallest;
  ecs_switch_t *sw;
  ecs_sparse_column_t *column;
  ecs_sparse_column_t *columns;
  int32_t sparse_smallest;
  _Bool first_iteration;
  ecs_page_cursor_t *cur_local;
  ecs_query_iter_t *iter_local;
  ecs_vector_t *sparse_columns_local;
  ecs_matched_table_t *matched_table_local;
  ecs_table_t *table_local;
  
  columns._0_4_ = iter->sparse_smallest;
  bVar5 = (int)columns == 0;
  if (bVar5) {
    columns._0_4_ = find_smallest_column(table,matched_table,sparse_columns);
    iter->sparse_smallest = (int)columns;
  }
  pvVar2 = _ecs_vector_first(sparse_columns,0x18,0x10);
  puVar3 = (undefined8 *)((long)pvVar2 + (long)((int)columns + -1) * 0x18);
  sw_00 = *(ecs_switch_t **)*puVar3;
  if (bVar5) {
    count = ecs_switch_first(sw_00,puVar3[1]);
  }
  else {
    count = ecs_switch_next(sw_00,iter->sparse_first);
  }
  if (count == -1) {
LAB_001265b1:
    iter->sparse_smallest = 0;
    iter->sparse_first = 0;
    table_local._4_4_ = -1;
  }
  else {
    iVar1 = ecs_vector_count(sparse_columns);
    do {
      for (local_70 = 0; local_70 < iVar1; local_70 = local_70 + 1) {
        if (((local_70 != (int)columns + -1) &&
            (puVar3 = (undefined8 *)((long)pvVar2 + (long)local_70 * 0x18),
            uVar4 = ecs_switch_get(*(ecs_switch_t **)*puVar3,count), uVar4 != puVar3[1])) &&
           (count = ecs_switch_next(sw_00,count), count == -1)) goto LAB_001265b1;
      }
    } while (local_70 != iVar1);
    iter->sparse_first = count;
    cur->first = count;
    cur->count = 1;
    table_local._4_4_ = 0;
  }
  return table_local._4_4_;
}

Assistant:

static
int sparse_column_next(
    ecs_table_t *table,
    ecs_matched_table_t *matched_table,
    ecs_vector_t *sparse_columns,
    ecs_query_iter_t *iter,
    ecs_page_cursor_t *cur)
{
    bool first_iteration = false;
    int32_t sparse_smallest;

    if (!(sparse_smallest = iter->sparse_smallest)) {
        sparse_smallest = iter->sparse_smallest = find_smallest_column(
            table, matched_table, sparse_columns);
        first_iteration = true;
    }

    sparse_smallest -= 1;

    ecs_sparse_column_t *columns = ecs_vector_first(
        sparse_columns, ecs_sparse_column_t);
    ecs_sparse_column_t *column = &columns[sparse_smallest];
    ecs_switch_t *sw, *sw_smallest = column->sw_column->data;
    ecs_entity_t case_smallest = column->sw_case;

    /* Find next entity to iterate in sparse column */
    int32_t first;
    if (first_iteration) {
        first = ecs_switch_first(sw_smallest, case_smallest);
    } else {
        first = ecs_switch_next(sw_smallest, iter->sparse_first);
    }

    if (first == -1) {
        goto done;
    }    

    /* Check if entity matches with other sparse columns, if any */
    int32_t i, count = ecs_vector_count(sparse_columns);
    do {
        for (i = 0; i < count; i ++) {
            if (i == sparse_smallest) {
                /* Already validated this one */
                continue;
            }

            column = &columns[i];
            sw = column->sw_column->data;

            if (ecs_switch_get(sw, first) != column->sw_case) {
                first = ecs_switch_next(sw_smallest, first);
                if (first == -1) {
                    goto done;
                }
            }
        }
    } while (i != count);

    cur->first = iter->sparse_first = first;
    cur->count = 1;

    return 0;
done:
    /* Iterated all elements in the sparse list, we should move to the
     * next matched table. */
    iter->sparse_smallest = 0;
    iter->sparse_first = 0;

    return -1;
}